

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SievingPrimes.cpp
# Opt level: O3

void __thiscall
primesieve::SievingPrimes::SievingPrimes
          (SievingPrimes *this,Erat *erat,uint64_t sieveSize,MemoryPool *memoryPool)

{
  (this->super_Erat).start_ = 0;
  (this->super_Erat).stop_ = 0;
  (this->super_Erat).segmentLow_ = 0xffffffffffffffff;
  (this->super_Erat).eratSmall_.super_Wheel30_t.stop_ = 0;
  (this->super_Erat).segmentHigh_ = 0;
  (this->super_Erat).sieve_.array_ = (uchar *)0x0;
  (this->super_Erat).sieve_.end_ = (uchar *)0x0;
  (this->super_Erat).sieve_.capacity_ = (uchar *)0x0;
  (this->super_Erat).maxEratSmall_ = 0;
  (this->super_Erat).maxEratMedium_ = 0;
  (this->super_Erat).eratSmall_.super_Wheel30_t._vptr_Wheel = (_func_int **)&PTR__EratSmall_00185b70
  ;
  (this->super_Erat).eratSmall_.maxPrime_ = 0;
  (this->super_Erat).eratSmall_.l1CacheSize_ = 0;
  (this->super_Erat).eratSmall_.primes_.array_ = (SievingPrime *)0x0;
  (this->super_Erat).eratSmall_.primes_.end_ = (SievingPrime *)0x0;
  (this->super_Erat).eratSmall_.primes_.capacity_ = (SievingPrime *)0x0;
  (this->super_Erat).eratBig_.super_Wheel210_t.stop_ = 0;
  (this->super_Erat).eratBig_.super_Wheel210_t._vptr_Wheel = (_func_int **)&PTR__EratBig_00185c00;
  (this->super_Erat).eratBig_.maxPrime_ = 0;
  (this->super_Erat).eratBig_.log2SieveSize_ = 0;
  (this->super_Erat).eratBig_.moduloSieveSize_ = 0;
  (this->super_Erat).eratBig_.memoryPool_ = (MemoryPool *)0x0;
  (this->super_Erat).eratBig_.buckets_.array_ = (SievingPrime **)0x0;
  (this->super_Erat).eratBig_.buckets_.end_ = (SievingPrime **)0x0;
  (this->super_Erat).eratBig_.buckets_.capacity_ = (SievingPrime **)0x0;
  (this->super_Erat).eratMedium_.super_Wheel30_t.stop_ = 0;
  (this->super_Erat).eratMedium_.super_Wheel30_t._vptr_Wheel =
       (_func_int **)&PTR__EratMedium_00185bc0;
  this->low_ = 0;
  this->tinyIdx_ = 0;
  this->i_ = 0;
  this->size_ = 0;
  (this->super_Erat).eratMedium_.currentBuckets_.end_ = (SievingPrime **)0x0;
  (this->super_Erat).eratMedium_.currentBuckets_.capacity_ = (SievingPrime **)0x0;
  (this->super_Erat).eratMedium_.buckets_.capacity_ = (SievingPrime **)0x0;
  (this->super_Erat).eratMedium_.currentBuckets_.array_ = (SievingPrime **)0x0;
  (this->super_Erat).eratMedium_.buckets_.array_ = (SievingPrime **)0x0;
  (this->super_Erat).eratMedium_.buckets_.end_ = (SievingPrime **)0x0;
  (this->super_Erat).eratMedium_.maxPrime_ = 0;
  (this->super_Erat).eratMedium_.memoryPool_ = (MemoryPool *)0x0;
  this->sieveIdx_ = 0xffffffffffffffff;
  (this->tinySieve_).capacity_ = (bool *)0x0;
  (this->tinySieve_).array_ = (bool *)0x0;
  (this->tinySieve_).end_ = (bool *)0x0;
  init(this,(EVP_PKEY_CTX *)erat);
  return;
}

Assistant:

SievingPrimes::SievingPrimes(Erat* erat,
                             uint64_t sieveSize,
                             MemoryPool& memoryPool)
{
  init(erat, sieveSize, memoryPool);
}